

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_value.c
# Opt level: O1

char * metacall_value_cast_string(void **v)

{
  type_id tVar1;
  value pvVar2;
  char *pcVar3;
  undefined8 unaff_RBX;
  type_id id;
  value unaff_retaddr;
  
  id = (type_id)((ulong)unaff_RBX >> 0x20);
  tVar1 = value_type_id(*v);
  if (tVar1 != 7) {
    pvVar2 = value_type_cast(unaff_retaddr,id);
    if (pvVar2 != (value)0x0) {
      *v = pvVar2;
    }
  }
  pcVar3 = value_to_string(*v);
  return pcVar3;
}

Assistant:

char *metacall_value_cast_string(void **v)
{
	if (value_type_id(*v) != TYPE_STRING)
	{
		value v_cast = value_type_cast(*v, TYPE_STRING);

		if (v_cast != NULL)
		{
			*v = v_cast;
		}
	}

	return value_to_string(*v);
}